

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxjenkins.c
# Opt level: O0

int nlalsm(double *vec,int N,int p,int delta,int q,double *phi,double *theta,int M,double *thetac,
          double *var,double eps,double *varcovar,double *residuals)

{
  double dVar1;
  double *oup;
  void *__ptr;
  double *w;
  double *phi_00;
  double *theta_00;
  double *phi_01;
  double *theta_01;
  double *__ptr_00;
  double *a;
  double *a_00;
  double *a_01;
  void *__ptr_01;
  void *__ptr_02;
  double *A_00;
  void *__ptr_03;
  double *b_00;
  double *array;
  double *x_00;
  double *__ptr_04;
  int *ipiv_00;
  int iVar2;
  double dVar3;
  double dVar4;
  int *ipiv;
  double *origval;
  double *resat;
  double *atinc;
  double *thetainc;
  double *phiinc;
  double *Atemp;
  double *binc;
  double *h;
  double *D;
  double *g;
  double *A;
  double *orig;
  double *theta0;
  double *phi0;
  double *x;
  double *at0;
  double *at;
  double *b;
  double *inp;
  double sumb;
  double suminc;
  double hmax;
  double tau;
  double temp;
  double stepsize;
  double eps2;
  double di;
  double e1;
  double vmul;
  double lam;
  int local_58;
  int itmax;
  int qd;
  int Norig;
  int it;
  int t2;
  int t;
  int k;
  int l;
  int j;
  int i;
  int retval;
  double eps_local;
  double *phi_local;
  int q_local;
  int delta_local;
  int p_local;
  int N_local;
  double *vec_local;
  
  dVar3 = sqrt(eps);
  vmul = 0.01;
  e1 = 2.0;
  qd = 0;
  t2 = p + q;
  local_58 = q + p * 0x14;
  if (local_58 < 0xf) {
    local_58 = 0xf;
  }
  suminc = 1.0;
  oup = (double *)malloc((long)(N - delta) << 3);
  __ptr = malloc((long)(N - delta) << 3);
  w = (double *)malloc((long)(N - delta) << 3);
  phi_00 = (double *)malloc((long)p << 3);
  theta_00 = (double *)malloc((long)q << 3);
  phi_01 = (double *)malloc((long)p << 3);
  theta_01 = (double *)malloc((long)q << 3);
  if (delta < 1) {
    for (l = 0; delta_local = N, l < N; l = l + 1) {
      oup[l] = vec[l];
      *(double *)((long)__ptr + (long)l * 8) = oup[l];
    }
  }
  else {
    delta_local = diff(vec,N,delta,oup);
    for (l = 0; l < delta_local; l = l + 1) {
      *(double *)((long)__ptr + (long)l * 8) = oup[l];
    }
  }
  USPE(oup,delta_local,p,q,phi,theta,thetac,var);
  if (M == 1) {
    for (l = 0; l < delta_local; l = l + 1) {
      oup[l] = oup[l] - *thetac;
    }
    M = 1;
    t2 = t2 + 1;
  }
  else {
    M = 0;
  }
  __ptr_00 = (double *)malloc((long)t2 << 3);
  a = (double *)malloc((long)(delta_local + local_58 + -1) << 3);
  a_00 = (double *)malloc((long)(delta_local + local_58 + -1) << 3);
  a_01 = (double *)malloc((long)(delta_local + local_58 + -1) << 3);
  __ptr_01 = malloc((long)(delta_local + local_58 + -1) << 3);
  __ptr_02 = malloc((long)t2 * 8 * (long)(delta_local + local_58 + -1));
  A_00 = (double *)malloc((long)t2 * 8 * (long)t2);
  __ptr_03 = malloc((long)t2 * 8 * (long)t2);
  b_00 = (double *)malloc((long)t2 << 3);
  array = (double *)malloc((long)t2 << 3);
  x_00 = (double *)malloc((long)t2 << 3);
  __ptr_04 = (double *)malloc((long)t2 << 3);
  ipiv_00 = (int *)malloc((long)t2 << 2);
  if (M == 1) {
    *__ptr_00 = *thetac;
  }
  for (l = 0; l < p; l = l + 1) {
    __ptr_00[M + l] = phi[l];
  }
  for (l = 0; l < q; l = l + 1) {
    __ptr_00[M + p + l] = theta[l];
  }
  avaluem(oup,delta_local,p,q,phi,theta,local_58,a);
  for (l = 0; l < delta_local + local_58 + -1; l = l + 1) {
    *(double *)((long)__ptr_01 + (long)l * 8) = a[l];
  }
  for (l = 0; l < t2; l = l + 1) {
    dVar4 = __ptr_00[l];
    __ptr_00[l] = __ptr_00[l] * dVar3 + __ptr_00[l];
    dVar1 = __ptr_00[l];
    if (M == 1) {
      for (k = 0; k < p; k = k + 1) {
        phi_00[k] = __ptr_00[k + 1];
      }
      for (k = 0; k < q; k = k + 1) {
        theta_00[k] = __ptr_00[p + 1 + k];
      }
      for (k = 0; k < delta_local; k = k + 1) {
        w[k] = *(double *)((long)__ptr + (long)k * 8) - *__ptr_00;
      }
    }
    else {
      for (k = 0; k < p; k = k + 1) {
        phi_00[k] = __ptr_00[k];
      }
      for (k = 0; k < q; k = k + 1) {
        theta_00[k] = __ptr_00[p + k];
      }
      for (k = 0; k < delta_local; k = k + 1) {
        w[k] = oup[k];
      }
    }
    avaluem(w,delta_local,p,q,phi_00,theta_00,local_58,a_00);
    for (k = 0; k < delta_local + local_58 + -1; k = k + 1) {
      *(double *)((long)__ptr_02 + (long)(l * (delta_local + local_58 + -1) + k) * 8) =
           (a[k] - a_00[k]) / (dVar1 - dVar4);
    }
    __ptr_00[l] = __ptr_00[l] - (dVar1 - dVar4);
  }
  for (l = 0; l < t2; l = l + 1) {
    for (k = 0; k < t2; k = k + 1) {
      A_00[l * t2 + k] = 0.0;
      for (t = 0; t < delta_local + local_58 + -1; t = t + 1) {
        iVar2 = l * t2 + k;
        A_00[iVar2] = *(double *)
                       ((long)__ptr_02 + (long)(l * (delta_local + local_58 + -1) + t) * 8) *
                      *(double *)
                       ((long)__ptr_02 + (long)(k * (delta_local + local_58 + -1) + t) * 8) +
                      A_00[iVar2];
      }
    }
  }
  for (l = 0; l < t2; l = l + 1) {
    b_00[l] = 0.0;
    for (t = 0; t < delta_local + local_58 + -1; t = t + 1) {
      b_00[l] = *(double *)((long)__ptr_02 + (long)(l * (delta_local + local_58 + -1) + t) * 8) *
                a[t] + b_00[l];
    }
    dVar4 = sqrt(A_00[l * t2 + l]);
    array[l] = dVar4;
  }
  array_max(array,t2);
LAB_0014b4d0:
  do {
    if (suminc < 1e-08 || 199 < qd) {
LAB_0014c13d:
      if (qd < 200) {
        if ((qd < 200) && (0 < qd)) {
          j = 1;
        }
      }
      else {
        j = 4;
      }
      *var = ((double)inp * 1.0) / (double)(((delta_local - p) - q) - M);
      if (M == 1) {
        tau = 0.0;
        for (l = 0; l < p; l = l + 1) {
          tau = phi_01[l] + tau;
        }
        *thetac = *__ptr_00 * (1.0 - tau);
      }
      else {
        *thetac = 0.0;
      }
      for (l = 0; l < p; l = l + 1) {
        phi[l] = phi_01[l];
      }
      for (l = 0; l < q; l = l + 1) {
        theta[l] = theta_01[l];
      }
      for (l = 0; l < t2; l = l + 1) {
        for (k = 0; k < t2; k = k + 1) {
          A_00[l * t2 + k] = 0.0;
          for (t = 0; t < delta_local + local_58 + -1; t = t + 1) {
            iVar2 = l * t2 + k;
            A_00[iVar2] = *(double *)
                           ((long)__ptr_02 + (long)(l * (delta_local + local_58 + -1) + t) * 8) *
                          *(double *)
                           ((long)__ptr_02 + (long)(k * (delta_local + local_58 + -1) + t) * 8) +
                          A_00[iVar2];
          }
        }
      }
      ludecomp(A_00,t2,ipiv_00);
      minverse(A_00,t2,ipiv_00,varcovar);
      for (l = 0; l < t2 * t2; l = l + 1) {
        varcovar[l] = varcovar[l] * *var;
      }
      for (l = local_58 + -1; l < delta_local + local_58 + -1; l = l + 1) {
        residuals[(l - local_58) + 1] = *(double *)((long)__ptr_01 + (long)l * 8);
      }
      free(oup);
      free(w);
      free(phi_00);
      free(theta_00);
      free(__ptr_00);
      free(a);
      free(a_00);
      free(__ptr_02);
      free(A_00);
      free(b_00);
      free(array);
      free(x_00);
      free(__ptr_04);
      free(ipiv_00);
      free(phi_01);
      free(theta_01);
      free(a_01);
      free(__ptr_01);
      free(__ptr);
      free(__ptr_03);
      return j;
    }
    qd = qd + 1;
    for (l = 0; l < t2; l = l + 1) {
      for (k = 0; k < t2; k = k + 1) {
        if (qd == 1) {
          A_00[l * t2 + k] = A_00[l * t2 + k] / (array[l] * array[k]);
        }
        if (l == k) {
          A_00[l * t2 + k] = vmul + 1.0;
        }
      }
    }
    if (qd == 1) {
      for (l = 0; l < t2; l = l + 1) {
        b_00[l] = b_00[l] / array[l];
      }
    }
    for (l = 0; l < t2 * t2; l = l + 1) {
      *(double *)((long)__ptr_03 + (long)l * 8) = A_00[l];
    }
    ludecomp(A_00,t2,ipiv_00);
    linsolve(A_00,t2,b_00,ipiv_00,x_00);
    for (l = 0; l < t2 * t2; l = l + 1) {
      A_00[l] = *(double *)((long)__ptr_03 + (long)l * 8);
    }
    for (k = 0; k < t2; k = k + 1) {
      x_00[k] = x_00[k] / array[k];
      __ptr_04[k] = __ptr_00[k] + x_00[k];
    }
    if (M == 1) {
      for (k = 0; k < p; k = k + 1) {
        phi_01[k] = __ptr_04[k + 1];
      }
      for (k = 0; k < q; k = k + 1) {
        theta_01[k] = __ptr_04[p + 1 + k];
      }
      for (k = 0; k < delta_local; k = k + 1) {
        w[k] = *(double *)((long)__ptr + (long)k * 8) - *__ptr_04;
      }
    }
    else {
      for (k = 0; k < p; k = k + 1) {
        phi_01[k] = __ptr_04[k];
      }
      for (k = 0; k < q; k = k + 1) {
        theta_01[k] = __ptr_04[p + k];
      }
      for (k = 0; k < delta_local; k = k + 1) {
        w[k] = oup[k];
      }
    }
    avaluem(w,delta_local,p,q,phi_01,theta_01,local_58,a_01);
    for (l = 0; l < delta_local + local_58 + -1; l = l + 1) {
      *(double *)((long)__ptr_01 + (long)l * 8) = a_01[l];
    }
    dVar4 = sosqm(a_01,delta_local + local_58 + -1);
    inp = (double *)sosqm(a,delta_local + local_58 + -1);
    suminc = array_max_abs(x_00,t2);
    if ((double)inp <= dVar4) {
      vmul = vmul * e1;
      e1 = e1 * 2.0;
      goto LAB_0014b4d0;
    }
    if (suminc < 1e-08) {
      j = 1;
      goto LAB_0014c13d;
    }
    for (l = 0; l < t2; l = l + 1) {
      __ptr_00[l] = __ptr_04[l];
    }
    vmul = vmul / e1;
    e1 = 2.0;
    if (M == 1) {
      for (k = 0; k < delta_local; k = k + 1) {
        w[k] = *(double *)((long)__ptr + (long)k * 8) - *__ptr_00;
      }
    }
    else {
      for (k = 0; k < delta_local; k = k + 1) {
        w[k] = oup[k];
      }
    }
    avaluem(w,delta_local,p,q,phi_01,theta_01,local_58,a);
    for (l = 0; l < delta_local + local_58 + -1; l = l + 1) {
      *(double *)((long)__ptr_01 + (long)l * 8) = a[l];
    }
    for (l = 0; l < t2; l = l + 1) {
      dVar4 = __ptr_00[l];
      __ptr_00[l] = __ptr_00[l] * dVar3 + __ptr_00[l];
      dVar1 = __ptr_00[l];
      if (M == 1) {
        for (k = 0; k < p; k = k + 1) {
          phi_00[k] = __ptr_00[k + 1];
        }
        for (k = 0; k < q; k = k + 1) {
          theta_00[k] = __ptr_00[p + 1 + k];
        }
        for (k = 0; k < delta_local; k = k + 1) {
          w[k] = *(double *)((long)__ptr + (long)k * 8) - *__ptr_00;
        }
      }
      else {
        for (k = 0; k < p; k = k + 1) {
          phi_00[k] = __ptr_00[k];
        }
        for (k = 0; k < q; k = k + 1) {
          theta_00[k] = __ptr_00[p + k];
        }
        for (k = 0; k < delta_local; k = k + 1) {
          w[k] = oup[k];
        }
      }
      avaluem(w,delta_local,p,q,phi_00,theta_00,local_58,a_00);
      for (k = 0; k < delta_local + local_58 + -1; k = k + 1) {
        *(double *)((long)__ptr_02 + (long)(l * (delta_local + local_58 + -1) + k) * 8) =
             (a[k] - a_00[k]) / (dVar1 - dVar4);
      }
      __ptr_00[l] = __ptr_00[l] - (dVar1 - dVar4);
    }
    for (l = 0; l < t2; l = l + 1) {
      for (k = 0; k < t2; k = k + 1) {
        A_00[l * t2 + k] = 0.0;
        for (t = 0; t < delta_local + local_58 + -1; t = t + 1) {
          iVar2 = l * t2 + k;
          A_00[iVar2] = *(double *)
                         ((long)__ptr_02 + (long)(l * (delta_local + local_58 + -1) + t) * 8) *
                        *(double *)
                         ((long)__ptr_02 + (long)(k * (delta_local + local_58 + -1) + t) * 8) +
                        A_00[iVar2];
        }
      }
    }
    for (l = 0; l < t2; l = l + 1) {
      b_00[l] = 0.0;
      for (t = 0; t < delta_local + local_58 + -1; t = t + 1) {
        b_00[l] = *(double *)((long)__ptr_02 + (long)(l * (delta_local + local_58 + -1) + t) * 8) *
                  a[t] + b_00[l];
      }
      dVar4 = sqrt(A_00[l * t2 + l]);
      array[l] = dVar4;
    }
    for (l = 0; l < t2; l = l + 1) {
      for (k = 0; k < t2; k = k + 1) {
        A_00[l * t2 + k] = A_00[l * t2 + k] / (array[l] * array[k]);
        if (l == k) {
          A_00[l * t2 + k] = vmul + 1.0;
        }
      }
    }
    for (l = 0; l < t2; l = l + 1) {
      b_00[l] = b_00[l] / array[l];
    }
  } while( true );
}

Assistant:

int nlalsm(double *vec,int N,int p,int delta, int q, double *phi,double *theta,
		int M,double *thetac,double *var,double eps,double *varcovar,double *residuals) {
	int retval,i,j,l,k,t,t2,it,Norig,qd,itmax;
	double lam,vmul,e1,di,eps2,stepsize,temp,tau,hmax,suminc,sumb;
	double *inp,*b,*at,*at0,*x,*phi0,*theta0,*orig,*A,*g,*D,*h,*binc,*Atemp;
	double *phiinc,*thetainc,*atinc,*resat,*origval;
	int *ipiv;


	eps2 = sqrt(eps);
	lam = 0.01;
	vmul = 2.0;
	e1 = 1.0e-08;
	it = 0;
	Norig = N;
	k = p + q;
	di = eps2;//0.001;//eps2;//0.001
	qd = q + 20 * p;

	if (qd < 15) {
		qd = 15;
	}
	hmax = 1;
	itmax = 200;

	inp = (double*) malloc(sizeof(double) * (N - delta));
	origval = (double*) malloc(sizeof(double) * (N - delta));
	orig = (double*) malloc(sizeof(double) * (N - delta));
	phi0 = (double*) malloc(sizeof(double) * p);
	theta0 = (double*) malloc(sizeof(double) * q);
	phiinc = (double*) malloc(sizeof(double) * p);
	thetainc = (double*) malloc(sizeof(double) * q);
	
	if (delta > 0) {
		N = diff(vec,Norig,delta,inp);
		for (i = 0; i < N;++i) {
			origval[i] = inp[i];
		}
	} else {
		for(i = 0; i < N;++i) {
			inp[i] = vec[i];
			origval[i] = inp[i];
		}
	}
	

	USPE(inp,N,p,q,phi,theta,thetac,var); // Initial Parameters

	if (M == 1) {
		for(i = 0; i < N;++i) {
			inp[i] -= *thetac;
		}
		M = 1;
		k++;
	} else {
		M = 0;
	}
	
	b = (double*) malloc(sizeof(double) * k);
	at = (double*) malloc(sizeof(double) * (N+qd-1));
	at0 = (double*) malloc(sizeof(double) * (N+qd-1));
	atinc = (double*) malloc(sizeof(double) * (N+qd-1));
	resat = (double*) malloc(sizeof(double) * (N+qd-1));
	x = (double*) malloc(sizeof(double) * k * (N+qd-1));
	A = (double*) malloc(sizeof(double) * k * k);
	Atemp = (double*) malloc(sizeof(double) * k * k);
	g = (double*) malloc(sizeof(double) * k);
	D = (double*) malloc(sizeof(double) * k);
	h = (double*) malloc(sizeof(double) * k);
	binc = (double*) malloc(sizeof(double) * k);
	ipiv = (int*) malloc(sizeof(int) * k);
	
	if (M == 1) {
		b[0] = *thetac;
	}
	
	for(i = 0; i < p;++i) {
		b[M+i] = phi[i];
	}
	
	for(i = 0; i < q;++i) {
		b[M+p+i] = theta[i];
	}
	
	//mdisplay(b,1,k);

    avaluem(inp,N,p,q,phi,theta,qd,at);
	
	for(i = 0; i < N+qd-1;++i) {
		resat[i] = at[i];
	}
	//mdisplay(at,1,N+qd-1);
	for(i = 0; i < k;++i) {
		stepsize = b[i]*di;//di;//b[i] * di;
		temp = b[i];
		b[i] += stepsize;
		stepsize = b[i] - temp;
		if (M == 1) {
			for(j = 0;j < p;++j) {
				phi0[j] = b[1+j];
			}
			for(j = 0; j < q;++j) {
				theta0[j] = b[p+1+j];
			}
			for(j = 0; j < N;++j) {
				orig[j] = origval[j] - b[0];
			}
		} else {
			for(j = 0;j < p;++j) {
				phi0[j] = b[j];
			}
			for(j = 0; j < q;++j) {
				theta0[j] = b[p+j];
			}
			for(j = 0; j < N;++j) {
				orig[j] = inp[j];
			}
		}
	    avaluem(orig,N,p,q,phi0,theta0,qd,at0);	
	    //mdisplay(inp,1,N);

		t = i * (N + qd - 1);
		
		for(j = 0; j < N + qd - 1;++j) {
			x[t+j] = (at[j] - at0[j]) / stepsize;
		}
		
		b[i] -= stepsize;
	}

	for(i = 0; i < k;++i) {
		t = i * (N + qd - 1);
		for(j = 0; j < k;++j) {
			t2 = j * (N + qd - 1);
			A[i*k+j] = 0.0;
			for(l = 0; l < N + qd -1;++l) {
				A[i*k+j] += x[t+l] * x[t2+l];
			}

		}
	}

	for(i = 0; i < k;++i) {
		t = i * (N + qd - 1);
		g[i] = 0.0;
		for(l = 0; l < N + qd - 1;++l) {
			g[i] += x[t+l] * at[l];
		}
		D[i] = sqrt(A[i*k+i]);
	}

	tau = array_max(D,k);
	//printf("TAU %g \n",tau);
	//mdisplay(x,k,N+qd-1);

	while (hmax >= e1 && it < itmax) {
		it++;
		for(i = 0; i < k;++i) {
			for(j = 0; j < k;++j) {
				if (it == 1) {
					A[i*k+j] = A[i*k+j] / (D[i] * D[j]);
				}
				if (i == j) {
					A[i*k+j] = 1.0 + lam;
				}
			}
		}

		if (it == 1) {
			for(i = 0; i < k; ++i) {
				g[i] = g[i] / D[i];
			}
		}

		for(i = 0; i < k*k;++i) {
			Atemp[i] = A[i];
		}
		ludecomp(A,k,ipiv);
		linsolve(A,k,g,ipiv,h);
		for(i = 0; i < k*k;++i) {
			A[i] = Atemp[i];
		}

		for(j = 0; j < k;++j) {
			h[j] = h[j] / D[j];
			binc[j] = b[j] + h[j];
		}

		if (M == 1) {
			for(j = 0;j < p;++j) {
				phiinc[j] = binc[1+j];
			}
			for(j = 0; j < q;++j) {
				thetainc[j] = binc[p+1+j];
			}

			for(j = 0; j < N;++j) {
				orig[j] = origval[j] - binc[0];
			}
		} else {
			for(j = 0;j < p;++j) {
				phiinc[j] = binc[j];
			}
			for(j = 0; j < q;++j) {
				thetainc[j] = binc[p+j];
			}
			for(j = 0; j < N;++j) {
				orig[j] = inp[j];
			}
		}

	    avaluem(orig,N,p,q,phiinc,thetainc,qd,atinc);
	    for(i = 0; i < N+qd-1;++i) {
	    	resat[i] = atinc[i];
	    }

	    suminc = sosqm(atinc,N+qd-1);
	    sumb = sosqm(at,N+qd-1);

	    hmax = array_max_abs(h,k);
	    //printf("HMAX %g %g %g \n",hmax,suminc,sumb);

	    if (suminc < sumb) {
	    	if (hmax < e1) {
	    		retval = 1;
	    		break;
	    	} else {
	    		for(i = 0; i < k;++i) {
	    			b[i] = binc[i];
	    		}
	    		lam = lam / vmul;
	    		vmul = 2.0;
				if (M == 1) {
					for(j = 0; j < N;++j) {
						orig[j] = origval[j] - b[0];
					}
				} else {
					for(j = 0; j < N;++j) {
						orig[j] = inp[j];
					}				
				}
			    avaluem(orig,N,p,q,phiinc,thetainc,qd,at);
			    for(i = 0; i < N+qd-1;++i) {
			    	resat[i] = at[i];
			    }
				
				for(i = 0; i < k;++i) {
					stepsize = b[i]*di;//di;//b[i] * di;
					temp = b[i];
					b[i] += stepsize;
					stepsize = b[i] - temp;
		
					if (M == 1) {
						for(j = 0;j < p;++j) {
							phi0[j] = b[1+j];
						}
						for(j = 0; j < q;++j) {
							theta0[j] = b[p+1+j];
						}

						for(j = 0; j < N;++j) {
							orig[j] = origval[j] - b[0];
						}

					} else {
						for(j = 0;j < p;++j) {
							phi0[j] = b[j];
						}
						for(j = 0; j < q;++j) {
							theta0[j] = b[p+j];
						}
						for(j = 0; j < N;++j) {
							orig[j] = inp[j];
						}
					}
				    avaluem(orig,N,p,q,phi0,theta0,qd,at0);	
					t = i * (N + qd - 1);
		
					for(j = 0; j < N + qd - 1;++j) {
						x[t+j] = (at[j] - at0[j]) / stepsize;
					}
		
					b[i] -= stepsize;
				}
				for(i = 0; i < k;++i) {
					t = i * (N + qd - 1);
					for(j = 0; j < k;++j) {
						t2 = j * (N + qd - 1);
						A[i*k+j] = 0.0;
						for(l = 0; l < N + qd -1;++l) {
							A[i*k+j] += x[t+l] * x[t2+l];
						}

					}
				}

				for(i = 0; i < k;++i) {
					t = i * (N + qd - 1);
					g[i] = 0.0;
					for(l = 0; l < N + qd - 1;++l) {
						g[i] += x[t+l] * at[l];
					}
					D[i] = sqrt(A[i*k+i]);
				}
				
				for(i = 0; i < k;++i) {
					for(j = 0; j < k;++j) {
						A[i*k+j] = A[i*k+j] / (D[i] * D[j]);
						if (i == j) {
							A[i*k+j] = 1.0 + lam;
						}
					}
				}

				for(i = 0; i < k; ++i) {
					g[i] = g[i] / D[i];
				}

	    	}
	    } else {
			lam=lam*vmul;
			vmul=2.0*vmul;
	    }

	}
	
	//printf("Iterations %d \n",it);
	
	if (it >= itmax) {
		retval = 4;
	} else if (it < itmax && it > 0) {
		retval = 1;
	}
	// Residual Variance
	*var = sumb * 1.0 /(N - p - q - M);
	//Constant Term
	if (M == 1) {
		temp = 0.0;
		for (i = 0;i < p;++i) {
			temp += phiinc[i];
		}
		*thetac = b[0] * (1.0 - temp);
	} else {
		*thetac = 0.0;
	}
	// Parameters Phi and Theta
	
	for (i = 0; i < p;++i) {
		phi[i] = phiinc[i];
	}
	for (i = 0; i < q;++i) {
		theta[i] = thetainc[i];
	}

	for(i = 0; i < k;++i) {
		t = i * (N + qd - 1);
		for(j = 0; j < k;++j) {
			t2 = j * (N + qd - 1);
			A[i*k+j] = 0.0;
			for(l = 0; l < N + qd -1;++l) {
				A[i*k+j] += x[t+l] * x[t2+l];
			}

		}
	}

	ludecomp(A,k,ipiv);
	minverse(A,k,ipiv,varcovar);

	//mdisplay(varcovar, 1, k*k);

	for(i = 0; i < k*k;++i) {
		varcovar[i] = varcovar[i] * (*var);
	}

	for(i = qd-1; i < N+qd-1;++i) {
		residuals[i-qd+1] = resat[i];
	}


	free(inp);
	free(orig);
	free(phi0);
	free(theta0);
	free(b);
	free(at);
	free(at0);
	free(x);
	free(A);
	free(g);
	free(D);
	free(h);
	free(binc);
	free(ipiv);
	free(phiinc);
	free(thetainc);
	free(atinc);
	free(resat);
	free(origval);
	free(Atemp);
	return retval;
}